

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrie.c
# Opt level: O2

tommy_trie_node *
trie_bucket_remove_existing
          (tommy_trie *trie,tommy_uint_t shift,tommy_trie_node **let_ptr,tommy_trie_node *remove,
          tommy_key_t key)

{
  long lVar1;
  tommy_node *ptVar2;
  tommy_allocator *ptVar3;
  bool bVar4;
  long lVar5;
  byte bVar6;
  undefined1 *puVar7;
  uint uVar8;
  undefined4 in_register_00000034;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  tommy_list *list;
  long in_FS_OFFSET;
  tommy_trie_node **let_back [10];
  
  list = (tommy_list *)CONCAT44(in_register_00000034,shift);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = 0x1b;
  uVar8 = 0;
  do {
    ptVar2 = *list;
    if (ptVar2 == (tommy_node *)0x0) {
LAB_001067ea:
      let_ptr = (tommy_trie_node **)0x0;
LAB_001067ec:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return (tommy_trie_node *)let_ptr;
      }
      __stack_chk_fail();
    }
    uVar11 = (ulong)uVar8;
    if (((ulong)ptVar2 & 1) == 0) {
      if ((let_ptr != (tommy_trie_node **)0x0) ||
         (let_ptr = &ptVar2->next, ptVar2->key == (uint)remove)) {
        tommy_list_remove_existing(list,(tommy_node *)let_ptr);
        if (uVar8 != 0 && *list == (tommy_list)0x0) {
          do {
            lVar5 = uVar11 - 1;
            uVar11 = uVar11 - 1;
            puVar7 = &(*let_back[lVar5])[-1].field_0x1f;
            bVar4 = false;
            uVar10 = 0;
            for (uVar9 = 0; uVar9 != 8; uVar9 = uVar9 + 1) {
              if (*(ulong *)(puVar7 + uVar9 * 8) != 0) {
                if (((*(ulong *)(puVar7 + uVar9 * 8) & 1) != 0) || (bVar4)) goto LAB_001067ec;
                bVar4 = true;
                uVar10 = uVar9 & 0xffffffff;
              }
            }
            if (!bVar4) {
              __assert_fail("count == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/third-party/tommyds/tommytrie.c"
                            ,0xee,
                            "tommy_trie_node *trie_bucket_remove_existing(tommy_trie *, tommy_uint_t, tommy_trie_node **, tommy_trie_node *, tommy_key_t)"
                           );
            }
            *let_back[lVar5] = *(tommy_trie_node **)(puVar7 + uVar10 * 8);
            ptVar3 = trie->alloc;
            *(tommy_allocator_entry_struct **)puVar7 = ptVar3->free_block;
            ptVar3->free_block = (tommy_allocator_entry_struct *)puVar7;
            ptVar3->count = ptVar3->count - 1;
            trie->node_count = trie->node_count - 1;
          } while (uVar11 != 0);
        }
        goto LAB_001067ec;
      }
      goto LAB_001067ea;
    }
    let_back[uVar11] = list;
    uVar8 = uVar8 + 1;
    list = (tommy_list *)((long)ptVar2 + (ulong)((uint)remove >> (bVar6 & 0x1f) & 7) * 8 + -1);
    bVar6 = bVar6 - 3;
  } while( true );
}

Assistant:

static tommy_trie_node* trie_bucket_remove_existing(tommy_trie* trie, tommy_uint_t shift, tommy_trie_node** let_ptr, tommy_trie_node* remove, tommy_key_t key)
{
	tommy_trie_node* node;
	tommy_trie_tree* tree;
	void* ptr;
	tommy_trie_node** let_back[TOMMY_TRIE_LEVEL_MAX + 1];
	tommy_uint_t level;
	tommy_uint_t i;
	tommy_uint_t count;
	tommy_uint_t last;

	level = 0;
recurse:
	ptr = *let_ptr;

	if (!ptr)
		return 0;

	if (trie_get_type(ptr) == TOMMY_TRIE_TYPE_TREE) {
		tree = trie_get_tree(ptr);

		/* save the path */
		let_back[level++] = let_ptr;

		/* go down one level */
		let_ptr = &tree->map[(key >> shift) & TOMMY_TRIE_TREE_MASK];
		shift -= TOMMY_TRIE_TREE_BIT;

		goto recurse;
	}

	node = tommy_cast(tommy_trie_node*, ptr);

	/* if the node to remove is not specified */
	if (!remove) {
		/* remove the first */
		remove = node;

		/* check if it's really the element to remove */
		if (remove->key != key)
			return 0;
	}

	tommy_list_remove_existing(let_ptr, remove);

	/* if the list is not empty, try to reduce */
	if (*let_ptr || !level)
		return remove;

reduce:
	/* go one level up */
	let_ptr = let_back[--level];

	tree = trie_get_tree(*let_ptr);

	/* check if there is only one child node */
	count = 0;
	last = 0;
	for (i = 0; i < TOMMY_TRIE_TREE_MAX; ++i) {
		if (tree->map[i]) {
			/* if we have a sub tree, we cannot reduce */
			if (trie_get_type(tree->map[i]) != TOMMY_TRIE_TYPE_NODE)
				return remove;
			/* if more than one node, we cannot reduce */
			if (++count > 1)
				return remove;
			last = i;
		}
	}

	/* here count is never 0, as we cannot have a tree with only one sub node */
	assert(count == 1);

	*let_ptr = tree->map[last];

	tommy_allocator_free(trie->alloc, tree);
	--trie->node_count;

	/* repeat until more level */
	if (level)
		goto reduce;

	return remove;
}